

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall trun::DirScanner::Scan(DirScanner *this,string *fromdir,bool use_recurse)

{
  pointer pcVar1;
  string local_38;
  
  this->recurse = use_recurse;
  pcVar1 = (fromdir->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + fromdir->_M_string_length);
  DoScan(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return &this->filenames;
}

Assistant:

std::vector<std::string> &Scan(std::string fromdir, bool use_recurse) {
            this->recurse = use_recurse;
            DoScan(fromdir);
            return filenames;
        }